

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_resend_hello_request(mbedtls_ssl_context *ssl)

{
  int iVar1;
  byte local_1d;
  uint local_1c;
  uchar doublings;
  uint32_t ratio;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->conf->renego_max_records < 0) {
    local_1d = 1;
    for (local_1c = ssl->conf->hs_timeout_max / ssl->conf->hs_timeout_min + 1; local_1c != 0;
        local_1c = local_1c >> 1) {
      local_1d = local_1d + 1;
    }
    iVar1 = ssl->renego_records_seen + 1;
    ssl->renego_records_seen = iVar1;
    if ((int)(uint)local_1d < iVar1) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x882,"no longer retransmitting hello request");
      return 0;
    }
  }
  iVar1 = ssl_write_hello_request(ssl);
  return iVar1;
}

Assistant:

static int ssl_resend_hello_request( mbedtls_ssl_context *ssl )
{
    /* If renegotiation is not enforced, retransmit until we would reach max
     * timeout if we were using the usual handshake doubling scheme */
    if( ssl->conf->renego_max_records < 0 )
    {
        uint32_t ratio = ssl->conf->hs_timeout_max / ssl->conf->hs_timeout_min + 1;
        unsigned char doublings = 1;

        while( ratio != 0 )
        {
            ++doublings;
            ratio >>= 1;
        }

        if( ++ssl->renego_records_seen > doublings )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "no longer retransmitting hello request" ) );
            return( 0 );
        }
    }

    return( ssl_write_hello_request( ssl ) );
}